

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O3

bool anon_unknown.dwarf_165f3fd::TestPresetExecutionShowOnlyHelper
               (ShowOnlyEnum *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  String local_50;
  
  if ((value != (Value *)0x0) && (bVar1 = Json::Value::isString(value), bVar1)) {
    Json::Value::asString_abi_cxx11_(&local_50,value);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      *out = Human;
    }
    else {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 != 0) goto LAB_003e7fea;
      *out = JsonV1;
    }
    return true;
  }
LAB_003e7fea:
  cmCMakePresetsErrors::INVALID_PRESET(value,state);
  return false;
}

Assistant:

bool TestPresetExecutionShowOnlyHelper(
  TestPreset::ExecutionOptions::ShowOnlyEnum& out, const Json::Value* value,
  cmJSONState* state)
{
  if (!value || !value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "human") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::Human;
    return true;
  }

  if (value->asString() == "json-v1") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::JsonV1;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}